

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuron.cpp
# Opt level: O1

void __thiscall
indk::Neuron::doCreateNewSynapseCluster
          (Neuron *this,vector<float,_std::allocator<float>_> *PosVector,uint R,float k1,int64_t Tl,
          int NT)

{
  pointer ppVar1;
  float *pfVar2;
  long lVar3;
  pointer EName;
  double dVar4;
  undefined1 auVar5 [16];
  initializer_list<float> __l;
  allocator_type local_89;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  double local_78;
  float local_6c;
  float local_68;
  undefined4 local_64;
  double local_60;
  double local_58;
  double local_50;
  vector<float,_std::allocator<float>_> local_48;
  
  EName = (this->Entries).
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->Entries).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)ppVar1 - (long)EName;
  if (lVar3 != 0) {
    lVar3 = (lVar3 >> 3) * -0x3333333333333333;
    auVar5._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar5._0_8_ = lVar3;
    auVar5._12_4_ = 0x45300000;
    local_88 = (float)(360.0 / ((auVar5._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)));
    pfVar2 = (PosVector->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_58 = (double)*pfVar2;
    local_78 = (double)R;
    local_60 = (double)pfVar2[1];
    local_80 = 0.0;
    local_84 = k1;
    do {
      local_50 = (double)(local_80 / 180.0) * 3.141592653589793;
      dVar4 = cos(local_50);
      local_7c = (float)(dVar4 * local_78 + local_58);
      dVar4 = sin(local_50);
      local_68 = (float)(dVar4 * local_78 + local_60);
      local_6c = local_7c;
      local_64 = 0;
      __l._M_len = 3;
      __l._M_array = &local_6c;
      std::vector<float,_std::allocator<float>_>::vector(&local_48,__l,&local_89);
      doCreateNewSynapse(this,&EName->first,&local_48,local_84,Tl,NT);
      if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      local_80 = local_80 + local_88;
      EName = EName + 1;
    } while (EName != ppVar1);
  }
  return;
}

Assistant:

void indk::Neuron::doCreateNewSynapseCluster(const std::vector<float>& PosVector, unsigned R, float k1, int64_t Tl, int NT) {
    float x = PosVector[0];
    float y = PosVector[1];

    float dfi = 360. / Entries.size();
    float fi = 0;
    float xr, yr;
    for (auto &ne: Entries) {
        xr = x + R * cos(fi/180*M_PI);
        yr = y + R * sin(fi/180*M_PI);
        doCreateNewSynapse(ne.first, {xr, yr, 0}, k1, Tl, NT);
        fi += dfi;
    }
}